

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O0

int Spatializer::DistanceAttenuationCallback
              (UnityAudioEffectState *state,float distanceIn,float attenuationIn,
              float *attenuationOut)

{
  float fVar1;
  float fVar2;
  float fVar3;
  EffectData *pEVar4;
  float fVar5;
  EffectData *data;
  float *attenuationOut_local;
  float attenuationIn_local;
  float distanceIn_local;
  UnityAudioEffectState *state_local;
  
  pEVar4 = UnityAudioEffectState::GetEffectData<Spatializer::EffectData>(state);
  fVar1 = pEVar4->p[0];
  fVar2 = pEVar4->p[1];
  fVar3 = pEVar4->p[2];
  fVar5 = FastMax(1.0,distanceIn);
  *attenuationOut = fVar3 * (1.0 / fVar5) + fVar1 * attenuationIn + fVar2;
  return 0;
}

Assistant:

static UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK DistanceAttenuationCallback(UnityAudioEffectState* state, float distanceIn, float attenuationIn, float* attenuationOut)
    {
        EffectData* data = state->GetEffectData<EffectData>();
        *attenuationOut =
            data->p[P_AUDIOSRCATTN] * attenuationIn +
            data->p[P_FIXEDVOLUME] +
            data->p[P_CUSTOMFALLOFF] * (1.0f / FastMax(1.0f, distanceIn));
        return UNITY_AUDIODSP_OK;
    }